

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O0

DisplayType __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::
get_display_type(ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this)

{
  DisplayType DVar1;
  pointer this_00;
  undefined1 local_20 [24];
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this_local;
  
  local_20._16_8_ = this;
  JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>
  ::operator->((JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>
                *)local_20);
  this_00 = std::
            unique_ptr<const_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
            ::operator->((unique_ptr<const_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          *)local_20);
  DVar1 = ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>::get_display_type
                    (this_00);
  std::
  unique_ptr<const_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<const_Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)local_20);
  return DVar1;
}

Assistant:

Outputs::Display::DisplayType get_display_type() const override {
			return video_->get_display_type();
		}